

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O1

int matchcharclass(char c,char *str)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  bVar5 = (byte)((c & 0xdfU) + 0xbf) < 0x1a;
  bVar6 = (byte)(c - 0x3aU) < 0xf6;
  bVar7 = (byte)(c - 0x30U) < 10;
  uVar4 = (uint)c;
  do {
    if ((((c != '-') && (cVar1 = *str, cVar1 != '\0')) && (cVar1 != '-')) &&
       ((str[1] == '-' && ((cVar1 <= c && str[2] != '\0') && c <= str[2])))) {
      return 1;
    }
    if (*str == '\\') {
      bVar2 = str[1];
      if (bVar2 < 100) {
        bVar3 = bVar6;
        if (bVar2 == 0x44) goto LAB_00115afd;
        if (bVar2 != 0x53) {
          if (bVar2 == 0x57) {
            if (bVar5 || c == '_') goto LAB_00115b02;
          }
          else {
LAB_00115af6:
            bVar3 = bVar2 == c;
          }
          goto LAB_00115afd;
        }
        if ((4 < uVar4 - 9) && (uVar4 != 0x20)) {
          return 1;
        }
      }
      else {
        bVar3 = bVar7;
        if (bVar2 != 100) {
          if (bVar2 == 0x73) {
            if ((uVar4 < 0x21) && ((0x100003e00U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
              return 1;
            }
            goto LAB_00115b02;
          }
          if (bVar2 != 0x77) goto LAB_00115af6;
          if (bVar5 || c == '_') {
            return 1;
          }
        }
LAB_00115afd:
        if (bVar3) {
          return 1;
        }
      }
LAB_00115b02:
      str = str + 1;
      if (bVar2 == c) {
        if (0x33 < uVar4 - 0x44) {
          return 1;
        }
        if ((0x8800100088001U >> ((ulong)(uVar4 - 0x44) & 0x3f) & 1) == 0) {
          return 1;
        }
      }
    }
    else if (*str == c) {
      if (c != '-') {
        return 1;
      }
      if (str[-1] != '\0') {
        return (uint)(str[1] == '\0');
      }
      return 1;
    }
    cVar1 = *str;
    str = str + 1;
    if (cVar1 == '\0') {
      return 0;
    }
  } while( true );
}

Assistant:

static int matchcharclass(char c, const char* str)
{
  do
  {
    if (matchrange(c, str))
    {
      return 1;
    }
    else if (str[0] == '\\')
    {
      /* Escape-char: increment str-ptr and match on next char */
      str += 1;
      if (matchmetachar(c, str))
      {
        return 1;
      } 
      else if ((c == str[0]) && !ismetachar(c))
      {
        return 1;
      }
    }
    else if (c == str[0])
    {
      if (c == '-')
      {
        return ((str[-1] == '\0') || (str[1] == '\0'));
      }
      else
      {
        return 1;
      }
    }
  }
  while (*str++ != '\0');

  return 0;
}